

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

bool Js::JavascriptStringHelpers<JITJavascriptString>::Equals
               (JITJavascriptString *aLeft,JITJavascriptString *aRight)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (aLeft != aRight) {
    if (aLeft->m_charLength != aRight->m_charLength) {
      return false;
    }
    if (aLeft->m_pszValue != aRight->m_pszValue) {
      iVar1 = PAL_wmemcmp(aLeft->m_pszValue,aRight->m_pszValue,(ulong)aLeft->m_charLength);
      bVar2 = iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool JavascriptStringHelpers<T>::Equals(T* aLeft, T* aRight)
    {
        if (aLeft == aRight) return true;

        // methods could get called a lot of times this can show up as regressions in benchmarks.
        volatile T** keepAliveLeftString = (volatile T**)& aLeft;
        volatile T** keepAliveRightString = (volatile T**)& aRight;
        auto keepAliveLambda = [&]() {
            UNREFERENCED_PARAMETER(keepAliveLeftString);
            UNREFERENCED_PARAMETER(keepAliveRightString);
        };

        if (aLeft->GetLength() != aRight->GetLength())
        {
            return false;
        }

        return JsUtil::CharacterBuffer<char16>::StaticEquals(aLeft->GetString(), aRight->GetString(), aLeft->GetLength());
    }